

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_push.c
# Opt level: O0

ssize_t mpt_connection_push(mpt_connection *con,size_t len,void *src)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  undefined1 local_78 [8];
  uint8_t buf [64];
  ssize_t ret;
  mpt_stream *srm;
  void *src_local;
  size_t len_local;
  mpt_connection *con_local;
  ssize_t sVar4;
  
  if ((con->out).sock._id < 0) {
    ret = (ssize_t)(con->out).buf._buf;
    if ((mpt_buffer *)ret == (mpt_buffer *)0x0) {
      return -1;
    }
  }
  else {
    ret = 0;
  }
  if ((((con->out).state & 0x10) == 0) && ((con->out)._idlen != '\0')) {
    if (0x40 < (con->out)._idlen) {
      return -2;
    }
    iVar1 = mpt_message_id2buf(con->cid,local_78,(con->out)._idlen);
    buf._56_8_ = SEXT48(iVar1);
    if ((long)buf._56_8_ < 0) {
      return buf._56_8_;
    }
    if (ret == 0) {
      buf._56_8_ = mpt_outdata_push(&con->out,(ulong)(con->out)._idlen,local_78);
      if ((long)buf._56_8_ < 0) {
        if (con->cid != 0) {
          deregisterCommand(&con->_wait,(ulong)con->cid);
        }
        sVar4._0_1_ = buf[0x38];
        sVar4._1_1_ = buf[0x39];
        sVar4._2_1_ = buf[0x3a];
        sVar4._3_1_ = buf[0x3b];
        sVar4._4_1_ = buf[0x3c];
        sVar4._5_1_ = buf[0x3d];
        sVar4._6_1_ = buf[0x3e];
        sVar4._7_1_ = buf[0x3f];
        return sVar4;
      }
    }
    else {
      buf._56_8_ = mpt_stream_push((mpt_stream *)ret,(ulong)(con->out)._idlen,local_78);
      if (-1 < (long)buf._56_8_) {
        if ((long)buf._56_8_ < (long)(ulong)(con->out)._idlen) {
          mpt_stream_push((mpt_stream *)ret,1,(void *)0x0);
          if (con->cid != 0) {
            deregisterCommand(&con->_wait,(ulong)con->cid);
          }
          return -0x11;
        }
        (con->out).state = (con->out).state | 0x10;
      }
    }
  }
  if (ret == 0) {
    buf._56_8_ = mpt_outdata_push(&con->out,len,src);
    if (((long)buf._56_8_ < 0) && (((con->out).state & 0x10) != 0)) {
      mpt_outdata_push(&con->out,1,(void *)0x0);
    }
  }
  else {
    buf._56_8_ = mpt_stream_push((mpt_stream *)ret,len,src);
    if ((long)buf._56_8_ < 0) {
      uVar2 = mpt_stream_flags((mpt_streaminfo *)ret);
      if ((uVar2 & 4) != 0) {
        mpt_stream_push((mpt_stream *)ret,1,(void *)0x0);
      }
      (con->out).state = (con->out).state & 0xef;
    }
    else if (len == 0) {
      (con->out).state = (con->out).state & 0xef;
      mpt_stream_flush((mpt_stream *)ret);
      con->cid = 0;
    }
    else {
      (con->out).state = (con->out).state | 0x10;
    }
  }
  if (((long)buf._56_8_ < 0) && (con->cid != 0)) {
    deregisterCommand(&con->_wait,(ulong)con->cid);
  }
  sVar3._0_1_ = buf[0x38];
  sVar3._1_1_ = buf[0x39];
  sVar3._2_1_ = buf[0x3a];
  sVar3._3_1_ = buf[0x3b];
  sVar3._4_1_ = buf[0x3c];
  sVar3._5_1_ = buf[0x3d];
  sVar3._6_1_ = buf[0x3e];
  sVar3._7_1_ = buf[0x3f];
  return sVar3;
}

Assistant:

extern ssize_t mpt_connection_push(MPT_STRUCT(connection) *con, size_t len, const void *src)
{
	MPT_STRUCT(stream) *srm;
	ssize_t ret;
	
	/* determine active backend */
	if (MPT_socket_active(&con->out.sock)) {
		srm = 0;
	}
	else if (!(srm = (void *) con->out.buf._buf)) {
		return MPT_ERROR(BadArgument);
	}
	/* new message start */
	if (!(con->out.state & MPT_OUTFLAG(Active))
	    && con->out._idlen) {
		uint8_t buf[64];
		
		/* create normalized ID */
		if (sizeof(buf) < con->out._idlen) {
			return MPT_ERROR(BadValue);
		}
		if ((ret = mpt_message_id2buf(con->cid, buf, con->out._idlen)) < 0) {
			return ret;
		}
		/* use stream backend */
		if (srm) {
			ret = mpt_stream_push(srm, con->out._idlen, buf);
			if (ret >= 0) {
				/* force atomic id push */
				if (ret < con->out._idlen) {
					mpt_stream_push(srm, 1, 0);
					if (con->cid) {
						deregisterCommand(&con->_wait, con->cid);
					}
					return MPT_ERROR(MissingBuffer);
				} else {
					con->out.state |= MPT_OUTFLAG(Active);
				}
			}
		}
		/* use socket backend (has atomic guarantee for ID setup) */
		else if ((ret = mpt_outdata_push(&con->out, con->out._idlen, buf)) < 0) {
			if (con->cid) {
				deregisterCommand(&con->_wait, con->cid);
			}
			return ret;
		}
	}
	/* regular message payload */
	if (srm) {
		if ((ret = mpt_stream_push(srm, len, src)) < 0) {
			/* push operation failed */
			if (mpt_stream_flags(&srm->_info) & MPT_STREAMFLAG(MesgActive)) {
				mpt_stream_push(srm, 1, 0);
			}
			con->out.state &= ~MPT_OUTFLAG(Active);
		}
		/* message completed */
		else if (!len) {
			con->out.state &= ~MPT_OUTFLAG(Active);
			mpt_stream_flush(srm);
			con->cid = 0;
		} else {
			con->out.state |= MPT_OUTFLAG(Active);
		}
	}
	else if ((ret = mpt_outdata_push(&con->out, len, src)) < 0) {
		if (con->out.state & MPT_OUTFLAG(Active)) {
			mpt_outdata_push(&con->out, 1, 0);
		}
	}
	if (ret < 0 && con->cid) {
		/* clear pending reply */
		deregisterCommand(&con->_wait, con->cid);
	}
	return ret;
}